

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacCom.c
# Opt level: O1

int Bac_CommandGet(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Bac_Man_t *pBVar4;
  char *pcVar5;
  char *pcVar6;
  
  pBVar4 = (Bac_Man_t *)pAbc->pAbcBac;
  bVar1 = false;
  Extra_UtilGetoptReset();
  bVar2 = false;
  while( true ) {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"mvh"), iVar3 == 0x76) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    if (iVar3 == -1) break;
    if (iVar3 != 0x6d) {
      Abc_Print(-2,"usage: @_get [-mvh]\n");
      Abc_Print(-2,"\t         inserts AIG or mapped network into the hierarchical design\n");
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (!bVar1) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-m     : toggle using mapped network from main-space [default = %s]\n",pcVar5)
      ;
      if (!bVar2) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (pBVar4 != (Bac_Man_t *)0x0) {
    if (bVar1) {
      if (pAbc->pNtkCur == (Abc_Ntk_t *)0x0) {
        pcVar5 = "Bac_CommandGet(): There is no current mapped design.\n";
        goto LAB_0030d238;
      }
      pBVar4 = (Bac_Man_t *)Bac_ManInsertAbc(pBVar4,pAbc->pNtkCur);
    }
    else {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        pcVar5 = "Bac_CommandGet(): There is no current AIG.\n";
        goto LAB_0030d238;
      }
      pBVar4 = Bac_ManInsertGia(pBVar4,pAbc->pGia);
    }
    if ((Bac_Man_t *)pAbc->pAbcBac != (Bac_Man_t *)0x0) {
      Bac_ManFree((Bac_Man_t *)pAbc->pAbcBac);
    }
    pAbc->pAbcBac = pBVar4;
    return 0;
  }
  pcVar5 = "Bac_CommandGet(): There is no current design.\n";
LAB_0030d238:
  Abc_Print(1,pcVar5);
  return 0;
}

Assistant:

int Bac_CommandGet( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Bac_Man_t * pNew = NULL, * p = Bac_AbcGetMan(pAbc);
    int c, fMapped = 0, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "mvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'm':
            fMapped ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Bac_CommandGet(): There is no current design.\n" );
        return 0;
    }
    if ( fMapped )
    {
        if ( pAbc->pNtkCur == NULL )
        {
            Abc_Print( 1, "Bac_CommandGet(): There is no current mapped design.\n" );
            return 0;
        }
        pNew = (Bac_Man_t *)Bac_ManInsertAbc( p, pAbc->pNtkCur );
    }
    else
    {
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( 1, "Bac_CommandGet(): There is no current AIG.\n" );
            return 0;
        }
        pNew = Bac_ManInsertGia( p, pAbc->pGia );
    }
    Bac_AbcUpdateMan( pAbc, pNew );
    return 0;
usage:
    Abc_Print( -2, "usage: @_get [-mvh]\n" );
    Abc_Print( -2, "\t         inserts AIG or mapped network into the hierarchical design\n" );
    Abc_Print( -2, "\t-m     : toggle using mapped network from main-space [default = %s]\n", fMapped? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}